

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  Mat *this_00;
  undefined1 auVar1 [16];
  _func_int **pp_Var2;
  int *piVar3;
  _func_int *p_Var4;
  long *plVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  uint num_input;
  undefined4 uVar12;
  Layer *pLVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  _func_int **pp_Var19;
  long lVar20;
  void *pvVar21;
  undefined4 *puVar22;
  byte bVar23;
  int k_5;
  int iVar24;
  uint uVar25;
  uint _h;
  int iVar26;
  long lVar27;
  int k_1;
  _func_int **pp_Var28;
  _func_int **pp_Var29;
  _func_int *p_Var30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  undefined4 *puVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  void *pvVar42;
  int k_2;
  ulong uVar43;
  int k_4;
  long lVar44;
  void *pvVar45;
  undefined4 *puVar46;
  int iVar47;
  int iVar48;
  _func_int **pp_Var49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  int k;
  ulong uVar54;
  int iVar55;
  undefined1 (*pauVar56) [16];
  long lVar57;
  long lVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_ZMM3 [64];
  long local_290;
  long local_288;
  long local_260;
  long local_250;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  ParamDict pd_6;
  long local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  void *local_1e0;
  ParamDict pd;
  size_t local_1c8;
  Allocator *local_1b8;
  int iStack_1b0;
  int iStack_1ac;
  undefined8 uStack_1a8;
  int aiStack_1a0 [2];
  size_t local_198;
  void *local_190;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 uStack_180;
  undefined4 uStack_178;
  long *local_170;
  undefined1 local_168 [16];
  undefined4 local_158;
  undefined8 local_150;
  long local_140;
  long local_138;
  long local_130;
  ulong local_128;
  long local_120;
  long local_118;
  ulong local_110;
  ParamDict pd_5;
  ModelBinFromMatArray local_80;
  int local_6c;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  auVar61 = in_ZMM3._0_16_;
  p_Var30 = this->_vptr_Convolution_x86_avx[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var30) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var30)) {
  case 1:
    pLVar13 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 2:
    pLVar13 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var30));
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 3:
    pLVar13 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var30));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var30) + 4));
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 4:
    pLVar13 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 5:
    pLVar13 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 6:
    pLVar13 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var30));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var30) + 4));
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  default:
    pLVar13 = (Layer *)0x0;
    goto LAB_0022dc16;
  }
  ParamDict::~ParamDict(&pd);
LAB_0022dc16:
  if (pLVar13 != (Layer *)0x0) {
    (*pLVar13->_vptr_Layer[4])(pLVar13,opt);
  }
  this->activation = pLVar13;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)this->_vptr_Convolution_x86_avx[-3])
      == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  p_Var30 = this->_vptr_Convolution_x86_avx[-3];
  uVar32 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var30);
  iVar55 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var30);
  iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var30);
  uVar54 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var30 + 4)) /
           (long)(iVar16 * iVar55);
  uVar54 = (long)((ulong)(uint)((int)uVar54 >> 0x1f) << 0x20 | uVar54 & 0xffffffff) /
           (long)(int)uVar32;
  num_input = (uint)uVar54;
  if ((((iVar55 == iVar16 && opt->use_packing_layout == false) &&
       (iVar48 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var30), iVar48 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var30) == iVar48)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var30) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var30) == 1)))) {
    pLVar13 = create_layer(6);
    this->convolution_dilation1 = pLVar13;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86_avx[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var2 = this->_vptr_Convolution_x86_avx;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var2[-3]) == 0) {
      local_198 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      iStack_1ac = 0;
      uStack_1a8._0_4_ = 0;
      uStack_1a8._4_4_ = 0;
      aiStack_1a0[0] = 0;
      p_Var30 = pp_Var2[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30)) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var30);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
        uVar8 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var30);
        pd.d._0_4_ = (undefined4)uVar8;
        pd.d._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        local_1b8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var30);
        uVar8 = *(undefined8 *)((long)&this->gemm + (long)p_Var30);
        uStack_1a8 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var30);
        iStack_1b0 = (int)uVar8;
        iStack_1ac = (int)((ulong)uVar8 >> 0x20);
        aiStack_1a0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var30);
        local_198 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var30);
      }
      pLVar13 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar13->_vptr_Layer[3])(pLVar13,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar18 = 0x40;
      do {
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar18) = 0;
        *(undefined1 (*) [16])((long)&local_218 + lVar18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd_6._vptr_ParamDict + lVar18 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&local_1f8 + lVar18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&local_1f0 + lVar18 + 4) = (undefined1  [16])0x0;
        lVar18 = lVar18 + 0x48;
      } while (lVar18 != 0xd0);
      p_Var30 = pp_Var2[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30)) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var30);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
        uVar8 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var30);
        pd.d._0_4_ = (undefined4)uVar8;
        pd.d._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        local_1b8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var30);
        uVar8 = *(undefined8 *)((long)&this->gemm + (long)p_Var30);
        uStack_1a8 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var30);
        iStack_1b0 = (int)uVar8;
        iStack_1ac = (int)((ulong)uVar8 >> 0x20);
        aiStack_1a0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var30);
        local_198 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var30);
      }
      p_Var30 = this->_vptr_Convolution_x86_avx[-3];
      if (&local_190 != (void **)((long)&(this->scale_in_data).elempack + (long)p_Var30)) {
        piVar3 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var30);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(uStack_184,uStack_188);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_170 == (long *)0x0) {
              if (local_190 != (void *)0x0) {
                free(local_190);
              }
            }
            else {
              (**(code **)(*local_170 + 0x18))();
            }
          }
        }
        local_190 = *(void **)((long)&(this->scale_in_data).elempack + (long)p_Var30);
        uVar8 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var30);
        uStack_188 = (undefined4)uVar8;
        uStack_184 = (undefined4)((ulong)uVar8 >> 0x20);
        uStack_180 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var30);
        uStack_178 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var30);
        local_170 = *(long **)((long)&(this->scale_in_data).c + (long)p_Var30);
        local_168 = *(undefined1 (*) [16])((long)&(this->scale_in_data).cstep + (long)p_Var30);
        local_158 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var30);
        local_150 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var30);
      }
      pLVar13 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar13->_vptr_Layer[3])(pLVar13,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar18 = 0x48;
      do {
        piVar3 = *(int **)((long)&pd.d + lVar18);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar45 = *(void **)((long)&pd._vptr_ParamDict + lVar18);
            if (*(long **)((long)&local_1b8 + lVar18) == (long *)0x0) {
              if (pvVar45 != (void *)0x0) {
                free(pvVar45);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_1b8 + lVar18) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_198 + lVar18) = 0;
        *(undefined1 (*) [16])((long)&pd.d + lVar18 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&iStack_1b0 + lVar18) = (undefined1  [16])0x0;
        *(undefined4 *)((long)aiStack_1a0 + lVar18) = 0;
        lVar18 = lVar18 + -0x48;
      } while (lVar18 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var30 = this->_vptr_Convolution_x86_avx[-3];
      piVar3 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var30);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar45 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
          plVar5 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var30);
          if (plVar5 == (long *)0x0) {
            if (pvVar45 != (void *)0x0) {
              free(pvVar45);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var30) = 0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).d + (long)p_Var30) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var30) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&this->gemm + (long)p_Var30) = (undefined1  [16])0x0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var30) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  iVar48 = 1;
  local_290 = 1;
  if (opt->use_packing_layout != false) {
    local_290 = (ulong)((uVar54 & 3) == 0) * 3 + 1;
    if ((uVar54 & 7) == 0) {
      local_290 = 8;
    }
    iVar48 = (uint)((uVar32 & 3) == 0) * 3 + 1;
    if ((uVar32 & 7) == 0) {
      iVar48 = 8;
    }
  }
  bVar23 = opt->use_winograd23_convolution;
  if ((((bool)bVar23 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar9 = false;
  }
  else {
    bVar9 = 8 < (int)uVar32 || 8 < (int)num_input;
  }
  if ((((iVar16 == 3) && (iVar55 == 3)) && (opt->use_winograd_convolution != false)) &&
     (((bVar9 && (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var30) == 1)) &&
      ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var30) == 1 &&
       ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var30) == 1 &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var30) == 1)))))))) {
    lVar18 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var30);
    if ((((lVar18 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var30)) ||
         (*(int *)(lVar18 + 0x2c) == 0)) || (*(int *)(lVar18 + 0x30) == 0)) &&
       (((lVar53 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var30),
         lVar53 == *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var30) ||
         (*(int *)(lVar53 + 0x2c) == 0)) || (*(int *)(lVar53 + 0x30) == 0)))) {
      if ((((int)uVar32 < 0x21) && (opt->use_winograd63_convolution != false)) &&
         ((int)num_input < 0x21)) {
LAB_0022ebc6:
        conv3x3s1_winograd63_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30),
                   &this->weight_winograd63_data,num_input,uVar32,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_0022eeb1;
LAB_0022ee96:
        conv3x3s1_winograd43_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30),
                   &this->weight_winograd43_data,num_input,uVar32,opt);
      }
    }
    else {
      lVar53 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var30);
      if (((lVar53 == *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var30)) ||
          (iVar55 = *(int *)(lVar53 + 0x2c), iVar55 == 0)) ||
         (iVar16 = *(int *)(lVar53 + 0x30), iVar16 == 0)) {
        iVar55 = *(int *)(lVar18 + 0x2c);
        iVar16 = *(int *)(lVar18 + 0x30);
        iVar48 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var30 + 4));
        if ((((iVar48 < 1) &&
             (iVar24 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var30),
             iVar24 < 1)) &&
            (iVar51 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var30 + 4)),
            iVar51 < 1)) &&
           (iVar47 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var30),
           iVar47 < 1)) {
          if ((iVar47 == -0xe9 && (iVar51 == -0xe9 && (iVar24 == -0xe9 && iVar48 == -0xe9))) ||
             (iVar47 == -0xea && (iVar51 == -0xea && (iVar24 == -0xea && iVar48 == -0xea))))
          goto LAB_0022e066;
        }
        else {
          iVar55 = iVar48 + iVar55 +
                   *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var30);
          iVar16 = iVar16 + *(int *)((long)&(this->weight_winograd43_data).data +
                                    (long)(p_Var30 + 4)) +
                   *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var30);
        }
      }
      else {
LAB_0022e066:
        iVar55 = iVar55 + 2;
        iVar16 = iVar16 + 2;
      }
      bVar9 = test_prefer_winograd63(num_input,uVar32,iVar55,iVar16);
      bVar10 = test_prefer_winograd23(num_input,uVar32,iVar55,iVar16);
      bVar15 = bVar10 & bVar23;
      if (!bVar10) {
        bVar23 = bVar9;
      }
      bVar11 = bVar9 & opt->use_winograd63_convolution;
      bVar23 = (opt->use_winograd63_convolution ^ 1U) & bVar9 | bVar23 ^ 1;
      if ((bVar23 == 1) && (opt->use_winograd43_convolution == false)) {
        bVar11 = bVar11 | opt->use_winograd63_convolution;
        bVar15 = bVar15 | opt->use_winograd63_convolution ^ 1U;
        bVar23 = 0;
      }
      if (bVar15 == 0) {
        if (bVar23 != 0) goto LAB_0022ee96;
        if ((bVar11 & 1) != 0) goto LAB_0022ebc6;
      }
      else {
LAB_0022eeb1:
        conv3x3s1_winograd23_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30),
                   &this->weight_winograd23_data,num_input,uVar32,opt);
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var4 = this->_vptr_Convolution_x86_avx[-3];
    p_Var30 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var4);
    pauVar56 = (undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var4);
    piVar3 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var4);
    if (piVar3 == (int *)0x0) goto LAB_0022ea57;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_0022ea57;
    pvVar45 = *(void **)(p_Var30 + 0x160);
    plVar5 = *(long **)(p_Var30 + 0x180);
  }
  else {
    iVar16 = get_cpu_level2_cache_size();
    p_Var30 = this->_vptr_Convolution_x86_avx[-3];
    uVar32 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var30);
    uVar54 = *(ulong *)((long)&(this->weight_winograd23_data).w + (long)p_Var30);
    auVar1 = *(undefined1 (*) [16])((long)&(this->weight_winograd23_data).d + (long)p_Var30);
    iVar35 = (int)uVar54;
    iVar51 = (int)(uVar54 >> 0x20);
    iVar24 = auVar1._8_4_;
    iVar47 = auVar1._12_4_;
    iVar55 = (int)local_290;
    if ((opt->use_sgemm_convolution == true) &&
       (iVar16 < (int)(auVar1._4_4_ * auVar1._0_4_ * uVar32 * iVar35 * iVar51 * iVar24 * iVar47 *
                       num_input * 8) || (0x10 < (int)num_input || 0x10 < (int)uVar32))) {
LAB_0022e130:
      pLVar13 = create_layer(0x4a);
      this->gemm = pLVar13;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86_avx[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar32 = iVar51 * iVar35;
      ParamDict::set(&pd_6,9,uVar32 * num_input);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86_avx[-3]) == 0) | 1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      this_00 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86_avx[-3]);
      Mat::reshape((Mat *)&pd,this_00,uVar32,num_input,*(int *)&this_00[-2].data,(Allocator *)0x0);
      Mat::create((Mat *)&pd_5,uVar32 * num_input,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86_avx[-3]),4,(Allocator *)0x0);
      pp_Var2 = this->_vptr_Convolution_x86_avx;
      if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var2[-3])) {
        lVar18 = 0;
        do {
          if (iVar55 <= (int)num_input) {
            pp_Var19 = (_func_int **)(local_1c8 * local_198 * lVar18 + (long)pd._vptr_ParamDict);
            lVar53 = 0;
            pp_Var49 = pd_5._vptr_ParamDict;
            do {
              if (0 < (int)uVar32) {
                uVar54 = 0;
                pp_Var29 = pp_Var19;
                lVar36 = local_290;
                pp_Var28 = pp_Var19;
                do {
                  do {
                    *(undefined4 *)pp_Var49 = *(undefined4 *)pp_Var29;
                    pp_Var49 = (_func_int **)((long)pp_Var49 + 4);
                    lVar36 = lVar36 + -1;
                    pp_Var29 = (_func_int **)((long)pp_Var29 + (long)iStack_1ac * local_1c8);
                  } while (lVar36 != 0);
                  uVar54 = uVar54 + 1;
                  pp_Var29 = (_func_int **)((long)pp_Var28 + 4);
                  lVar36 = local_290;
                  pp_Var28 = pp_Var29;
                } while (uVar54 != uVar32);
              }
              lVar53 = lVar53 + local_290;
              pp_Var19 = (_func_int **)((long)pp_Var19 + (long)iStack_1ac * local_1c8 * local_290);
            } while (lVar53 < (long)((long)(int)num_input - (ulong)(iVar55 - 1)));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var2[-3]));
      }
      piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86_avx[-3]) == 0) {
        piVar3 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1b8 = (Allocator *)0x0;
        iStack_1b0 = 0;
        iStack_1ac = 0;
        uStack_1a8._0_4_ = 0;
        uStack_1a8._4_4_ = 0;
        aiStack_1a0[0] = 0;
        local_198 = 0;
        pLVar13 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_80,(Mat *)&pd);
        (*pLVar13->_vptr_Layer[3])(pLVar13,&local_80);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_80);
        piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        lVar18 = 0x40;
        do {
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar18) = 0;
          *(undefined1 (*) [16])((long)&local_218 + lVar18) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd_6._vptr_ParamDict + lVar18 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_1f8 + lVar18) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_1f0 + lVar18 + 4) = (undefined1  [16])0x0;
          lVar18 = lVar18 + 0x48;
        } while (lVar18 != 0xd0);
        piVar3 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1b8 = (Allocator *)0x0;
        iStack_1b0 = 0;
        iStack_1ac = 0;
        uStack_1a8._0_4_ = 0;
        uStack_1a8._4_4_ = 0;
        aiStack_1a0[0] = 0;
        local_198 = 0;
        p_Var30 = this->_vptr_Convolution_x86_avx[-3];
        if (&local_190 != (void **)((long)&(this->scale_in_data).elempack + (long)p_Var30)) {
          piVar3 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var30);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = (int *)CONCAT44(uStack_184,uStack_188);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_170 == (long *)0x0) {
                if (local_190 != (void *)0x0) {
                  free(local_190);
                }
              }
              else {
                (**(code **)(*local_170 + 0x18))();
              }
            }
          }
          local_190 = *(void **)((long)&(this->scale_in_data).elempack + (long)p_Var30);
          uVar8 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var30);
          uStack_188 = (undefined4)uVar8;
          uStack_184 = (undefined4)((ulong)uVar8 >> 0x20);
          uStack_180 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var30);
          uStack_178 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var30);
          local_170 = *(long **)((long)&(this->scale_in_data).c + (long)p_Var30);
          local_168 = *(undefined1 (*) [16])((long)&(this->scale_in_data).cstep + (long)p_Var30);
          local_158 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var30);
          local_150 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var30);
        }
        pLVar13 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_80,(Mat *)&pd);
        (*pLVar13->_vptr_Layer[3])(pLVar13,&local_80);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_80);
        lVar18 = 0x48;
        do {
          piVar3 = *(int **)((long)&pd.d + lVar18);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar45 = *(void **)((long)&pd._vptr_ParamDict + lVar18);
              if (*(long **)((long)&local_1b8 + lVar18) == (long *)0x0) {
                if (pvVar45 != (void *)0x0) {
                  free(pvVar45);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_1b8 + lVar18) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_198 + lVar18) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar18 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar18) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&iStack_1b0 + lVar18) = (undefined1  [16])0x0;
          *(undefined4 *)((long)aiStack_1a0 + lVar18) = 0;
          lVar18 = lVar18 + -0x48;
        } while (lVar18 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar3 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (pd_5._vptr_ParamDict != (_func_int **)0x0)) {
          free(pd_5._vptr_ParamDict);
        }
      }
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      auVar60._8_4_ = 1;
      auVar60._0_8_ = 0x100000001;
      auVar60._12_4_ = 1;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar54;
      auVar60 = vpcmpeqd_avx(auVar59,auVar60);
      auVar60 = vpmovsxdq_avx(auVar60);
      auVar61 = vpcmpeqd_avx(auVar61,auVar61);
      if (((auVar61 & ~auVar60) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          -1 < SUB161(auVar61 & ~auVar60,0xf)) goto LAB_0022e130;
      auVar61 = vpunpcklqdq_avx(auVar59,auVar1);
      if (((iVar48 == 8) && (iVar55 == 8)) &&
         (((auVar61 == _DAT_005970a0 && ((iVar24 == 1 && (iVar47 == 1)))) ||
          ((auVar61 == _DAT_005970b0 && ((iVar24 == 1 && (iVar47 == 1)))))))) {
LAB_0022e506:
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30),
                   &this->weight_data_tm,num_input,uVar32,iVar35,iVar51,iVar55,iVar48);
      }
      else {
        if ((iVar48 == 8) && (iVar55 == 1)) {
          if (((auVar61 == _DAT_005970a0) && (iVar24 == 1)) && (iVar47 == 1)) goto LAB_0022e506;
          auVar60 = vpcmpeqd_avx(auVar61,ZEXT416(3));
          if (((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) && (iVar51 == 3)) {
            auVar60 = vpcmpeqd_avx(auVar1,_DAT_005970c0);
            uVar12 = vmovmskps_avx(auVar60);
            if ((char)uVar12 == '\x0f') goto LAB_0022e506;
          }
        }
        if ((((auVar61 ^ _DAT_005970a0) == (undefined1  [16])0x0) && (iVar24 == 1)) &&
           ((iVar48 == 1 && ((iVar47 == 1 && (iVar55 == 8)))))) goto LAB_0022e506;
        if ((iVar48 == 4) && (iVar55 == 1)) {
          if ((((auVar61 ^ _DAT_005970a0) == (undefined1  [16])0x0) && (iVar24 == 1)) &&
             (iVar47 == 1)) goto LAB_0022e506;
          auVar61 = vpcmpeqd_avx(auVar61,ZEXT416(3));
          if (((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) && (iVar51 == 3)) {
            auVar61 = vpcmpeqd_avx(auVar1,_DAT_005970c0);
            uVar12 = vmovmskps_avx(auVar61);
            if ((char)uVar12 == '\x0f') goto LAB_0022e506;
          }
        }
        local_128 = (ulong)(int)uVar32;
        uVar33 = iVar51 * iVar35;
        uVar54 = (ulong)uVar33;
        uVar25 = num_input;
        if (7 < (int)uVar32) {
          if ((int)num_input < 8) {
            if ((int)num_input < 4) {
              if ((int)num_input < 2) {
                iVar55 = uVar33 * 8;
                iVar16 = (uVar32 & 1) + (uVar32 >> 3) + ((uint)(local_128 >> 2) & 1) +
                         (uint)((uVar32 >> 1 & 1) != 0);
                goto LAB_0022edfd;
              }
              iVar55 = uVar33 * 0x10;
              uVar25 = (num_input & 1) + 1;
            }
            else {
              iVar55 = uVar33 * 0x20;
              uVar25 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
            }
          }
          else {
            iVar55 = uVar33 * 0x40;
            uVar25 = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                     (uint)((num_input >> 1 & 1) != 0);
          }
          iVar16 = (uVar32 & 1) + (uVar32 >> 3) + ((uint)(local_128 >> 2) & 1) +
                   (uint)((uVar32 >> 1 & 1) != 0);
          goto LAB_0022edfd;
        }
        if ((int)uVar32 < 4) {
          if ((int)uVar32 < 2) {
            uVar17 = uVar32;
            if ((int)num_input < 8) {
              if ((int)num_input < 4) {
                uVar25 = uVar33;
                _h = num_input;
                if (1 < (int)num_input) {
                  uVar25 = uVar33 * 2;
                  _h = (num_input & 1) + 1;
                }
              }
              else {
                uVar25 = uVar33 * 4;
                _h = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
              }
            }
            else {
              uVar25 = uVar33 * 8;
              _h = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                   (uint)((num_input >> 1 & 1) != 0);
            }
          }
          else {
            if ((int)num_input < 8) {
              if ((int)num_input < 4) {
                if ((int)num_input < 2) {
                  iVar55 = uVar33 * 2;
                  iVar16 = (uVar32 & 1) + 1;
                  goto LAB_0022edfd;
                }
                uVar25 = uVar33 * 4;
                _h = (num_input & 1) + 1;
              }
              else {
                _h = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                uVar25 = uVar33 * 8;
              }
            }
            else {
              uVar25 = uVar33 * 0x10;
              _h = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                   (uint)((num_input >> 1 & 1) != 0);
            }
            uVar17 = (uVar32 & 1) + 1;
          }
LAB_0022f3bd:
          Mat::create(&this->weight_data_tm,uVar25,_h,uVar17,4,(Allocator *)0x0);
        }
        else {
          if (7 < (int)num_input) {
            uVar25 = uVar33 * 0x20;
            _h = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                 (uint)((num_input >> 1 & 1) != 0);
LAB_0022f025:
            uVar17 = (uVar32 & 1) + 1 + (uint)((uVar32 >> 1 & 1) != 0);
            goto LAB_0022f3bd;
          }
          if ((int)num_input < 4) {
            if (1 < (int)num_input) {
              uVar25 = uVar33 * 8;
              _h = (num_input & 1) + 1;
              goto LAB_0022f025;
            }
            iVar55 = uVar33 * 4;
            iVar16 = (uVar32 & 1) + 1 + (uint)((uVar32 >> 1 & 1) != 0);
          }
          else {
            iVar55 = uVar33 * 0x10;
            uVar25 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
            iVar16 = (uVar32 & 1) + 1 + (uint)((uVar32 >> 1 & 1) != 0);
          }
LAB_0022edfd:
          Mat::create(&this->weight_data_tm,iVar55,uVar25,iVar16,4,(Allocator *)0x0);
        }
        uVar31 = 0;
        local_118 = (long)(int)uVar33;
        lVar18 = (long)(int)num_input;
        if (7 < (int)uVar32) {
          local_1f0 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
          iVar26 = uVar33 * num_input;
          sVar6 = (this->weight_data_tm).elemsize;
          sVar7 = (this->weight_data_tm).cstep;
          pvVar45 = (this->weight_data_tm).data;
          iVar35 = uVar33 * num_input;
          iVar55 = iVar35 * 8;
          local_1e0 = (void *)(uVar54 * 0x20);
          lVar53 = local_118 * 4;
          iVar51 = iVar35 * 2;
          iVar16 = iVar35 * 3;
          iVar48 = iVar35 * 5;
          iVar47 = iVar35 * 6;
          iVar24 = iVar35 * 7;
          uVar25 = iVar35 * 4;
          local_1e8 = local_118 * 0x10;
          local_1f8 = local_118 * 8;
          local_218 = uVar54 * 4;
          iVar35 = 0;
          uVar43 = 0;
          do {
            local_110 = (ulong)uVar25;
            local_140 = CONCAT44(local_140._4_4_,iVar24);
            local_138 = CONCAT44(local_138._4_4_,iVar47);
            local_120 = CONCAT44(local_120._4_4_,iVar26);
            puVar37 = (undefined4 *)((uVar43 >> 3) * sVar6 * sVar7 + (long)pvVar45);
            local_130 = CONCAT44(local_130._4_4_,iVar48);
            if ((int)num_input < 8) {
              uVar31 = 0;
            }
            else {
              local_288 = 0;
              uVar14 = 0;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar36 = local_288;
                  do {
                    puVar22 = puVar37;
                    lVar34 = 0;
                    lVar38 = lVar36;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar34) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar35 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 4) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar26 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 8) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar51 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 0xc) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar16 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 0x10) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)(int)uVar25 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 0x14) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar48 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 0x18) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar47 * 4);
                      *(undefined4 *)((long)puVar22 + lVar34 + 0x1c) =
                           *(undefined4 *)((long)local_1f0 + lVar38 + (long)iVar24 * 4);
                      lVar34 = lVar34 + 0x20;
                      lVar38 = lVar38 + lVar53;
                    } while ((int)lVar34 != 0x100);
                    uVar31 = uVar31 + 1;
                    lVar36 = lVar36 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar34);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar34);
                }
                uVar31 = uVar14 + 8;
                lVar36 = uVar14 + 0xf;
                local_288 = local_288 + (long)local_1e0;
                uVar14 = uVar31;
              } while (lVar36 < lVar18);
            }
            lVar44 = (long)iVar24 * 4;
            lVar57 = (long)iVar47 * 4;
            lVar50 = (long)iVar48 * 4;
            lVar38 = (long)(int)uVar25 * 4;
            lVar34 = (long)iVar16 * 4;
            lVar52 = (long)iVar51 * 4;
            lVar36 = (long)iVar26 * 4;
            lVar58 = (long)iVar35 * 4;
            if ((int)((uint)uVar31 | 3) < (int)num_input) {
              lVar20 = lVar53 * (uVar31 & 0xffffffff);
              lVar41 = 0;
              uVar14 = uVar31 & 0xffffffff;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar27 = lVar41;
                  do {
                    puVar22 = puVar37;
                    lVar40 = 0;
                    lVar39 = lVar27;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar40) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar58 + lVar20);
                      *(undefined4 *)((long)puVar22 + lVar40 + 4) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar36);
                      *(undefined4 *)((long)puVar22 + lVar40 + 8) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar52 + lVar20);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0xc) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar34);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x10) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar38 + lVar20);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x14) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar50 + lVar20);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x18) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar57);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x1c) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar44);
                      lVar40 = lVar40 + 0x20;
                      lVar39 = lVar39 + lVar53;
                    } while ((int)lVar40 != 0x80);
                    uVar31 = uVar31 + 1;
                    lVar27 = lVar27 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar40);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar40);
                }
                uVar31 = uVar14 + 4;
                lVar27 = uVar14 + 7;
                lVar41 = lVar41 + local_1e8;
                uVar14 = uVar31;
              } while (lVar27 < lVar18);
            }
            if ((int)((uint)uVar31 | 1) < (int)num_input) {
              lVar20 = lVar53 * (uVar31 & 0xffffffff);
              lVar41 = 0;
              uVar14 = uVar31 & 0xffffffff;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar27 = lVar41;
                  do {
                    puVar22 = puVar37;
                    lVar40 = 0;
                    lVar39 = lVar27;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar40) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar40 + 4) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar36);
                      *(undefined4 *)((long)puVar22 + lVar40 + 8) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar52);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0xc) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar34);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x10) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar38);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x14) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar50);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x18) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar20 + lVar57);
                      *(undefined4 *)((long)puVar22 + lVar40 + 0x1c) =
                           *(undefined4 *)((long)local_1f0 + lVar39 + lVar44 + lVar20);
                      lVar40 = lVar40 + 0x20;
                      lVar39 = lVar39 + lVar53;
                    } while ((int)lVar40 == 0x20);
                    uVar31 = uVar31 + 1;
                    lVar27 = lVar27 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar40);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar40);
                }
                uVar31 = uVar14 + 2;
                lVar27 = uVar14 + 3;
                lVar41 = lVar41 + local_1f8;
                uVar14 = uVar31;
              } while (lVar27 < lVar18);
            }
            if ((int)uVar31 < (int)num_input) {
              lVar20 = (long)(int)uVar31;
              lVar41 = lVar53 * lVar20;
              lVar27 = lVar44 + lVar41 + (long)local_1f0;
              lVar57 = lVar57 + lVar41 + (long)local_1f0;
              lVar44 = lVar50 + lVar41 + (long)local_1f0;
              lVar50 = lVar38 + lVar41 + (long)local_1f0;
              lVar34 = lVar34 + lVar41 + (long)local_1f0;
              lVar52 = lVar52 + lVar41 + (long)local_1f0;
              lVar36 = lVar36 + lVar41 + (long)local_1f0;
              lVar38 = lVar41 + lVar58 + (long)local_1f0;
              do {
                if (0 < (int)uVar33) {
                  lVar58 = 0;
                  puVar22 = puVar37;
                  do {
                    puVar46 = puVar22;
                    puVar22 = puVar37 + lVar58 * 2;
                    *puVar22 = *(undefined4 *)(lVar38 + lVar58);
                    puVar22[1] = *(undefined4 *)(lVar36 + lVar58);
                    puVar22[2] = *(undefined4 *)(lVar52 + lVar58);
                    puVar22[3] = *(undefined4 *)(lVar34 + lVar58);
                    puVar22[4] = *(undefined4 *)(lVar50 + lVar58);
                    puVar22[5] = *(undefined4 *)(lVar44 + lVar58);
                    puVar22[6] = *(undefined4 *)(lVar57 + lVar58);
                    puVar22[7] = *(undefined4 *)(lVar27 + lVar58);
                    lVar58 = lVar58 + 4;
                    puVar22 = puVar22 + 8;
                  } while (local_218 != lVar58);
                  puVar37 = puVar46 + 8;
                }
                lVar20 = lVar20 + 1;
                lVar27 = lVar27 + lVar53;
                lVar57 = lVar57 + lVar53;
                lVar44 = lVar44 + lVar53;
                lVar50 = lVar50 + lVar53;
                lVar34 = lVar34 + lVar53;
                lVar52 = lVar52 + lVar53;
                lVar36 = lVar36 + lVar53;
                lVar38 = lVar38 + lVar53;
              } while (lVar20 != lVar18);
            }
            uVar31 = uVar43 + 8;
            uVar14 = uVar43 + 0xf;
            iVar35 = iVar35 + iVar55;
            iVar26 = iVar26 + iVar55;
            iVar51 = iVar51 + iVar55;
            iVar16 = iVar16 + iVar55;
            uVar25 = uVar25 + iVar55;
            iVar48 = iVar48 + iVar55;
            iVar47 = iVar47 + iVar55;
            iVar24 = iVar24 + iVar55;
            uVar43 = uVar31;
          } while (uVar14 < uVar32);
        }
        uVar25 = (uint)uVar31;
        if ((int)(uVar25 | 3) < (int)local_128) {
          lVar36 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
          local_1f0 = (this->weight_data_tm).data;
          local_120 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
          iVar48 = uVar33 * num_input;
          iVar16 = (uVar25 | 3) * iVar48;
          iVar55 = iVar48 * 4;
          local_110 = CONCAT44(local_110._4_4_,iVar55);
          local_218 = uVar54 * 0x20;
          lVar53 = local_118 * 4;
          iVar24 = (uVar25 + 2) * iVar48;
          iVar51 = (uVar25 + 1) * iVar48;
          iVar48 = iVar48 * uVar25;
          local_1e0 = (void *)(local_118 * 0x10);
          local_1e8 = local_118 * 8;
          uVar43 = uVar31 & 0xffffffff;
          do {
            puVar37 = (undefined4 *)
                      ((ulong)(((uint)(uVar43 >> 3) & 0x1fffffff) +
                              (uint)(((uint)uVar43 >> 2 & 1) != 0)) * local_120 + (long)local_1f0);
            if ((int)num_input < 8) {
              uVar31 = 0;
            }
            else {
              lVar38 = lVar36 + (long)iVar16 * 4;
              lVar34 = lVar36 + (long)iVar24 * 4;
              lVar44 = lVar36 + (long)iVar51 * 4;
              lVar50 = lVar36 + (long)iVar48 * 4;
              uVar14 = 0;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar52 = lVar38;
                  lVar57 = lVar34;
                  lVar58 = lVar50;
                  lVar20 = lVar44;
                  do {
                    puVar22 = puVar37;
                    lVar27 = 0;
                    lVar41 = 0;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar41) = *(undefined4 *)(lVar58 + lVar27);
                      *(undefined4 *)((long)puVar22 + lVar41 + 4) = *(undefined4 *)(lVar20 + lVar27)
                      ;
                      *(undefined4 *)((long)puVar22 + lVar41 + 8) = *(undefined4 *)(lVar57 + lVar27)
                      ;
                      *(undefined4 *)((long)puVar22 + lVar41 + 0xc) =
                           *(undefined4 *)(lVar52 + lVar27);
                      lVar41 = lVar41 + 0x10;
                      lVar27 = lVar27 + lVar53;
                    } while ((int)lVar41 != 0x80);
                    uVar31 = uVar31 + 1;
                    lVar52 = lVar52 + 4;
                    lVar57 = lVar57 + 4;
                    lVar20 = lVar20 + 4;
                    lVar58 = lVar58 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar41);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar41);
                }
                uVar31 = uVar14 + 8;
                lVar52 = uVar14 + 0xf;
                lVar38 = lVar38 + local_218;
                lVar34 = lVar34 + local_218;
                lVar44 = lVar44 + local_218;
                lVar50 = lVar50 + local_218;
                uVar14 = uVar31;
              } while (lVar52 < lVar18);
            }
            lVar38 = (long)iVar16 * 4;
            lVar44 = (long)iVar24 * 4;
            lVar34 = (long)iVar51 * 4;
            local_1f8 = (long)iVar48 * 4;
            if ((int)((uint)uVar31 | 3) < (int)num_input) {
              lVar50 = lVar53 * (uVar31 & 0xffffffff);
              lVar52 = 0;
              uVar14 = uVar31 & 0xffffffff;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar57 = lVar52;
                  do {
                    puVar22 = puVar37;
                    lVar20 = 0;
                    lVar58 = lVar57;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar20) =
                           *(undefined4 *)(lVar50 + local_1f8 + lVar36 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar20 + 4) =
                           *(undefined4 *)(lVar50 + lVar34 + lVar36 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar20 + 8) =
                           *(undefined4 *)(lVar50 + lVar44 + lVar36 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar20 + 0xc) =
                           *(undefined4 *)(lVar50 + lVar38 + lVar36 + lVar58);
                      lVar20 = lVar20 + 0x10;
                      lVar58 = lVar58 + lVar53;
                    } while ((int)lVar20 != 0x40);
                    uVar31 = uVar31 + 1;
                    lVar57 = lVar57 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar20);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar20);
                }
                uVar31 = uVar14 + 4;
                lVar57 = uVar14 + 7;
                lVar52 = lVar52 + (long)local_1e0;
                uVar14 = uVar31;
              } while (lVar57 < lVar18);
            }
            if ((int)((uint)uVar31 | 1) < (int)num_input) {
              lVar50 = lVar53 * (uVar31 & 0xffffffff);
              lVar52 = 0;
              uVar14 = uVar31 & 0xffffffff;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar57 = lVar52;
                  do {
                    puVar22 = puVar37;
                    lVar20 = 0;
                    lVar58 = lVar57;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar20) =
                           *(undefined4 *)(lVar50 + local_1f8 + lVar36 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar20 + 4) =
                           *(undefined4 *)(lVar50 + lVar34 + lVar36 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar20 + 8) =
                           *(undefined4 *)(lVar50 + lVar44 + lVar36 + lVar58);
                      *(undefined4 *)((long)puVar22 + lVar20 + 0xc) =
                           *(undefined4 *)(lVar50 + lVar38 + lVar36 + lVar58);
                      lVar20 = lVar20 + 0x10;
                      lVar58 = lVar58 + lVar53;
                    } while ((int)lVar20 == 0x10);
                    uVar31 = uVar31 + 1;
                    lVar57 = lVar57 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar20);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar20);
                }
                uVar31 = uVar14 + 2;
                lVar57 = uVar14 + 3;
                lVar52 = lVar52 + local_1e8;
                uVar14 = uVar31;
              } while (lVar57 < lVar18);
            }
            if ((int)uVar31 < (int)num_input) {
              lVar50 = (long)(int)uVar31;
              lVar52 = lVar53 * lVar50;
              lVar38 = lVar38 + lVar52 + lVar36;
              lVar57 = lVar44 + lVar52 + lVar36;
              lVar44 = lVar34 + lVar52 + lVar36;
              lVar34 = lVar52 + local_1f8 + lVar36;
              do {
                if (0 < (int)uVar33) {
                  lVar52 = 0;
                  puVar22 = puVar37;
                  do {
                    puVar46 = puVar22;
                    puVar22 = puVar37 + lVar52;
                    *puVar22 = *(undefined4 *)(lVar34 + lVar52);
                    puVar22[1] = *(undefined4 *)(lVar44 + lVar52);
                    puVar22[2] = *(undefined4 *)(lVar57 + lVar52);
                    puVar22[3] = *(undefined4 *)(lVar38 + lVar52);
                    lVar52 = lVar52 + 4;
                    puVar22 = puVar22 + 4;
                  } while (uVar54 * 4 != lVar52);
                  puVar37 = puVar46 + 4;
                }
                lVar50 = lVar50 + 1;
                lVar38 = lVar38 + lVar53;
                lVar57 = lVar57 + lVar53;
                lVar44 = lVar44 + lVar53;
                lVar34 = lVar34 + lVar53;
              } while (lVar50 != lVar18);
            }
            uVar31 = uVar43 + 4;
            lVar38 = uVar43 + 7;
            iVar16 = iVar16 + iVar55;
            iVar24 = iVar24 + iVar55;
            iVar51 = iVar51 + iVar55;
            iVar48 = iVar48 + iVar55;
            uVar43 = uVar31;
          } while (lVar38 < (long)local_128);
        }
        uVar25 = (uint)uVar31 | 1;
        if ((int)uVar25 < (int)uVar32) {
          local_140 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
          pvVar45 = (this->weight_data_tm).data;
          sVar6 = (this->weight_data_tm).elemsize;
          sVar7 = (this->weight_data_tm).cstep;
          local_120 = uVar54 * 4;
          local_38 = local_140 + (long)(int)(uVar33 * 7) * 4;
          iVar55 = uVar33 * num_input;
          iVar16 = uVar25 * iVar55;
          local_6c = iVar55 * 2;
          local_110 = uVar54 * 0x20;
          local_40 = local_140 + (long)(int)(uVar33 * 6) * 4;
          local_48 = local_140 + (long)(int)(uVar33 * 5) * 4;
          local_50 = local_140 + (long)(int)(uVar33 * 4) * 4;
          local_58 = local_140 + (long)(int)(uVar33 * 3) * 4;
          local_60 = local_140 + (long)(int)(uVar33 * 2) * 4;
          iVar55 = iVar55 * (uint)uVar31;
          lVar36 = local_118 * 0x10;
          lVar53 = local_118 * 4;
          local_68 = local_140 + local_118 * 4;
          uVar43 = uVar31 & 0xffffffff;
          do {
            local_130 = (long)iVar16;
            local_138 = (long)iVar55;
            puVar37 = (undefined4 *)
                      ((ulong)(((uint)(uVar43 >> 2) & 1) + ((uint)(uVar43 >> 3) & 0x1fffffff) +
                              (uint)(((uint)uVar43 >> 1 & 1) != 0)) * sVar6 * sVar7 + (long)pvVar45)
            ;
            if ((int)num_input < 8) {
              pvVar42 = (void *)0x0;
            }
            else {
              local_260 = local_38 + local_130 * 4;
              local_238 = local_40 + local_130 * 4;
              local_250 = local_48 + local_130 * 4;
              lVar38 = local_50 + local_130 * 4;
              lVar34 = local_58 + local_130 * 4;
              local_240 = local_60 + local_130 * 4;
              lVar44 = local_140 + local_130 * 4;
              local_220 = local_38 + local_138 * 4;
              lVar50 = local_50 + local_138 * 4;
              local_230 = local_58 + local_138 * 4;
              local_228 = local_60 + local_138 * 4;
              lVar52 = local_68 + local_138 * 4;
              pvVar42 = (void *)0x0;
              pvVar21 = (void *)(local_48 + local_138 * 4);
              lVar57 = local_140 + local_138 * 4;
              lVar58 = local_40 + local_138 * 4;
              lVar20 = local_68 + local_130 * 4;
              do {
                local_1f8 = lVar20;
                local_1e8 = lVar58;
                local_218 = lVar57;
                local_1e0 = pvVar21;
                local_1f0 = pvVar42;
                if (0 < (int)uVar33) {
                  lVar57 = 0;
                  do {
                    *puVar37 = *(undefined4 *)(local_218 + lVar57);
                    puVar37[1] = *(undefined4 *)(lVar52 + lVar57);
                    puVar37[2] = *(undefined4 *)(local_228 + lVar57);
                    puVar37[3] = *(undefined4 *)(local_230 + lVar57);
                    puVar37[4] = *(undefined4 *)(lVar50 + lVar57);
                    puVar37[5] = *(undefined4 *)((long)local_1e0 + lVar57);
                    puVar37[6] = *(undefined4 *)(local_1e8 + lVar57);
                    puVar37[7] = *(undefined4 *)(local_220 + lVar57);
                    puVar37[8] = *(undefined4 *)(lVar44 + lVar57);
                    puVar37[9] = *(undefined4 *)(local_1f8 + lVar57);
                    puVar37[10] = *(undefined4 *)(local_240 + lVar57);
                    puVar37[0xb] = *(undefined4 *)(lVar34 + lVar57);
                    puVar37[0xc] = *(undefined4 *)(lVar38 + lVar57);
                    puVar37[0xd] = *(undefined4 *)(local_250 + lVar57);
                    puVar37[0xe] = *(undefined4 *)(local_238 + lVar57);
                    puVar37[0xf] = *(undefined4 *)(local_260 + lVar57);
                    puVar37 = puVar37 + 0x10;
                    lVar57 = lVar57 + 4;
                  } while (local_120 != lVar57);
                }
                pvVar42 = (void *)((long)local_1f0 + 8);
                local_260 = local_260 + local_110;
                local_238 = local_238 + local_110;
                local_250 = local_250 + local_110;
                lVar38 = lVar38 + local_110;
                lVar34 = lVar34 + local_110;
                local_240 = local_240 + local_110;
                lVar44 = lVar44 + local_110;
                local_220 = local_220 + local_110;
                lVar50 = lVar50 + local_110;
                local_230 = local_230 + local_110;
                local_228 = local_228 + local_110;
                lVar52 = lVar52 + local_110;
                pvVar21 = (void *)((long)local_1e0 + local_110);
                lVar57 = local_218 + local_110;
                lVar58 = local_1e8 + local_110;
                lVar20 = local_1f8 + local_110;
              } while ((long)local_1f0 + 0xf < lVar18);
            }
            local_130 = local_130 * 4;
            local_138 = local_138 * 4;
            if ((int)((uint)pvVar42 | 3) < (int)num_input) {
              pvVar21 = (void *)((ulong)pvVar42 & 0xffffffff);
              lVar38 = lVar53 * (long)pvVar21 + local_130;
              lVar34 = local_58 + lVar38;
              lVar44 = local_60 + lVar38;
              lVar57 = ((long)pvVar21 * 4 + 4) * local_118;
              lVar58 = local_130 + local_140 + lVar57;
              lVar38 = lVar38 + local_140;
              lVar52 = lVar53 * (long)pvVar21 + local_138;
              lVar20 = local_58 + lVar52;
              lVar57 = lVar57 + local_138 + local_140;
              lVar50 = local_60 + lVar52;
              lVar52 = lVar52 + local_140;
              do {
                if (0 < (int)uVar33) {
                  lVar41 = 0;
                  puVar22 = puVar37;
                  do {
                    puVar46 = puVar22;
                    puVar22 = puVar37 + lVar41 * 2;
                    *puVar22 = *(undefined4 *)(lVar52 + lVar41);
                    puVar22[1] = *(undefined4 *)(lVar57 + lVar41);
                    puVar22[2] = *(undefined4 *)(lVar50 + lVar41);
                    puVar22[3] = *(undefined4 *)(lVar20 + lVar41);
                    puVar22[4] = *(undefined4 *)(lVar38 + lVar41);
                    puVar22[5] = *(undefined4 *)(lVar58 + lVar41);
                    puVar22[6] = *(undefined4 *)(lVar44 + lVar41);
                    puVar22[7] = *(undefined4 *)(lVar34 + lVar41);
                    lVar41 = lVar41 + 4;
                    puVar22 = puVar22 + 8;
                  } while (local_120 != lVar41);
                  puVar37 = puVar46 + 8;
                }
                pvVar42 = (void *)((long)pvVar21 + 4);
                lVar41 = (long)pvVar21 + 7;
                lVar34 = lVar34 + lVar36;
                lVar44 = lVar44 + lVar36;
                lVar58 = lVar58 + lVar36;
                lVar38 = lVar38 + lVar36;
                lVar20 = lVar20 + lVar36;
                lVar50 = lVar50 + lVar36;
                lVar57 = lVar57 + lVar36;
                lVar52 = lVar52 + lVar36;
                pvVar21 = pvVar42;
              } while (lVar41 < lVar18);
            }
            if ((int)((uint)pvVar42 | 1) < (int)num_input) {
              lVar38 = lVar53 * (long)((ulong)pvVar42 & 0xffffffff);
              lVar34 = lVar38 + local_130 + local_140;
              lVar38 = lVar38 + local_138 + local_140;
              pvVar21 = (void *)((ulong)pvVar42 & 0xffffffff);
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  lVar44 = lVar38;
                  lVar50 = lVar34;
                  do {
                    puVar22 = puVar37;
                    lVar52 = 0;
                    lVar57 = 0;
                    do {
                      *(undefined4 *)((long)puVar22 + lVar57) = *(undefined4 *)(lVar44 + lVar52);
                      *(undefined4 *)((long)puVar22 + lVar57 + 4) = *(undefined4 *)(lVar50 + lVar52)
                      ;
                      lVar57 = lVar57 + 8;
                      lVar52 = lVar52 + lVar53;
                    } while ((int)lVar57 == 8);
                    uVar31 = uVar31 + 1;
                    lVar50 = lVar50 + 4;
                    lVar44 = lVar44 + 4;
                    puVar37 = (undefined4 *)((long)puVar22 + lVar57);
                  } while (uVar31 != uVar54);
                  puVar37 = (undefined4 *)((long)puVar22 + lVar57);
                }
                pvVar42 = (void *)((long)pvVar21 + 2);
                lVar44 = (long)pvVar21 + 3;
                lVar34 = lVar34 + local_118 * 8;
                lVar38 = lVar38 + local_118 * 8;
                pvVar21 = pvVar42;
              } while (lVar44 < lVar18);
            }
            if ((int)pvVar42 < (int)num_input) {
              lVar38 = (long)(int)pvVar42;
              lVar44 = local_130 + lVar53 * lVar38 + local_140;
              lVar34 = lVar53 * lVar38 + local_138 + local_140;
              do {
                if (0 < (int)uVar33) {
                  uVar31 = 0;
                  do {
                    *puVar37 = *(undefined4 *)(lVar34 + uVar31 * 4);
                    puVar37[1] = *(undefined4 *)(lVar44 + uVar31 * 4);
                    puVar37 = puVar37 + 2;
                    uVar31 = uVar31 + 1;
                  } while (uVar54 != uVar31);
                }
                lVar38 = lVar38 + 1;
                lVar44 = lVar44 + lVar53;
                lVar34 = lVar34 + lVar53;
              } while (lVar38 != lVar18);
            }
            uVar31 = uVar43 + 2;
            lVar38 = uVar43 + 3;
            iVar16 = iVar16 + local_6c;
            iVar55 = iVar55 + local_6c;
            uVar43 = uVar31;
          } while (lVar38 < (long)local_128);
        }
        iVar55 = (int)uVar31;
        if (iVar55 < (int)uVar32) {
          lVar36 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var30);
          local_218 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
          local_1e0 = (this->weight_data_tm).data;
          uVar31 = (ulong)iVar55;
          iVar16 = uVar33 * num_input;
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar16);
          iVar55 = iVar55 * iVar16;
          lVar53 = local_118 * 4;
          do {
            pvVar45 = (void *)((ulong)(((uint)uVar31 & 1) + ((uint)(uVar31 >> 3) & 0x1fffffff) +
                                       ((uint)(uVar31 >> 2) & 1) +
                                      (uint)(((uint)uVar31 >> 1 & 1) != 0)) * local_218 +
                              (long)local_1e0);
            if ((int)num_input < 8) {
              uVar43 = 0;
            }
            else {
              puVar37 = (undefined4 *)(lVar36 + (long)iVar55 * 4);
              uVar14 = 0;
              do {
                if (0 < (int)uVar33) {
                  uVar43 = 0;
                  puVar22 = puVar37;
                  do {
                    pvVar42 = pvVar45;
                    lVar38 = 0;
                    puVar46 = puVar22;
                    do {
                      *(undefined4 *)((long)pvVar42 + lVar38) = *puVar46;
                      lVar38 = lVar38 + 4;
                      puVar46 = puVar46 + local_118;
                    } while ((int)lVar38 != 0x20);
                    uVar43 = uVar43 + 1;
                    puVar22 = puVar22 + 1;
                    pvVar45 = (void *)(lVar38 + (long)pvVar42);
                  } while (uVar43 != uVar54);
                  pvVar45 = (void *)((long)pvVar42 + lVar38);
                }
                uVar43 = uVar14 + 8;
                lVar38 = uVar14 + 0xf;
                puVar37 = puVar37 + uVar54 * 8;
                uVar14 = uVar43;
              } while (lVar38 < lVar18);
            }
            lVar38 = (long)iVar55 * 4;
            if ((int)((uint)uVar43 | 3) < (int)num_input) {
              puVar37 = (undefined4 *)(lVar53 * (uVar43 & 0xffffffff) + lVar38 + lVar36);
              uVar14 = uVar43 & 0xffffffff;
              do {
                if (0 < (int)uVar33) {
                  uVar43 = 0;
                  puVar22 = puVar37;
                  do {
                    pvVar42 = pvVar45;
                    lVar34 = 0;
                    puVar46 = puVar22;
                    do {
                      *(undefined4 *)((long)pvVar42 + lVar34) = *puVar46;
                      lVar34 = lVar34 + 4;
                      puVar46 = puVar46 + local_118;
                    } while ((int)lVar34 != 0x10);
                    uVar43 = uVar43 + 1;
                    puVar22 = puVar22 + 1;
                    pvVar45 = (void *)(lVar34 + (long)pvVar42);
                  } while (uVar43 != uVar54);
                  pvVar45 = (void *)((long)pvVar42 + lVar34);
                }
                uVar43 = uVar14 + 4;
                lVar34 = uVar14 + 7;
                puVar37 = puVar37 + local_118 * 4;
                uVar14 = uVar43;
              } while (lVar34 < lVar18);
            }
            if ((int)((uint)uVar43 | 1) < (int)num_input) {
              puVar37 = (undefined4 *)(lVar53 * (uVar43 & 0xffffffff) + lVar38 + lVar36);
              uVar14 = uVar43 & 0xffffffff;
              do {
                if (0 < (int)uVar33) {
                  uVar43 = 0;
                  puVar22 = puVar37;
                  do {
                    pvVar42 = pvVar45;
                    lVar34 = 0;
                    puVar46 = puVar22;
                    do {
                      *(undefined4 *)((long)pvVar42 + lVar34) = *puVar46;
                      lVar34 = lVar34 + 4;
                      puVar46 = puVar46 + local_118;
                    } while ((int)lVar34 == 4);
                    uVar43 = uVar43 + 1;
                    puVar22 = puVar22 + 1;
                    pvVar45 = (void *)(lVar34 + (long)pvVar42);
                  } while (uVar43 != uVar54);
                  pvVar45 = (void *)((long)pvVar42 + lVar34);
                }
                uVar43 = uVar14 + 2;
                lVar34 = uVar14 + 3;
                puVar37 = puVar37 + local_118 * 2;
                uVar14 = uVar43;
              } while (lVar34 < lVar18);
            }
            if ((int)uVar43 < (int)num_input) {
              lVar34 = (long)(int)uVar43;
              lVar38 = lVar53 * lVar34 + lVar38 + lVar36;
              do {
                if (0 < (int)uVar33) {
                  lVar44 = 0;
                  do {
                    *(undefined4 *)((long)pvVar45 + lVar44) = *(undefined4 *)(lVar38 + lVar44);
                    lVar44 = lVar44 + 4;
                  } while (uVar54 * 4 - lVar44 != 0);
                  pvVar45 = (void *)((long)pvVar45 + lVar44);
                }
                lVar34 = lVar34 + 1;
                lVar38 = lVar38 + lVar53;
              } while (lVar34 != lVar18);
            }
            uVar31 = uVar31 + 1;
            iVar55 = iVar55 + iVar16;
          } while (uVar31 != local_128);
        }
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var4 = this->_vptr_Convolution_x86_avx[-3];
    p_Var30 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var4);
    pauVar56 = (undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var4);
    piVar3 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var4);
    if (piVar3 == (int *)0x0) goto LAB_0022ea57;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_0022ea57;
    pvVar45 = *(void **)(p_Var30 + 0x160);
    plVar5 = *(long **)(p_Var30 + 0x180);
  }
  if (plVar5 == (long *)0x0) {
    if (pvVar45 != (void *)0x0) {
      free(pvVar45);
    }
  }
  else {
    (**(code **)(*plVar5 + 0x18))();
  }
LAB_0022ea57:
  *(undefined8 *)(p_Var30 + 0x1a0) = 0;
  *(undefined1 (*) [16])(*pauVar56 + 0xc) = (undefined1  [16])0x0;
  *pauVar56 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(p_Var30 + 0x188) = (undefined1  [16])0x0;
  *(undefined4 *)(p_Var30 + 0x198) = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}